

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

FUNCTION_RETURN
license::os::getAdapterInfos
          (vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
           *adapterInfos)

{
  ushort uVar1;
  long lVar2;
  iterator __position;
  vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>> *this;
  int iVar3;
  size_t sVar4;
  iterator iVar5;
  mapped_type *__dest;
  int *piVar6;
  char *pcVar7;
  uint uVar8;
  FUNCTION_RETURN FVar9;
  long *plVar10;
  __node_base _Var11;
  long lVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar14;
  ifaddrs *ifaddr;
  string if_name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
  adapterByName;
  OsAdapterInfo newAdapter;
  long *local_4b0;
  vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>> *local_4a8;
  key_type local_4a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_480;
  undefined1 local_444 [4];
  char local_440 [1040];
  
  local_480._M_buckets = &local_480._M_single_bucket;
  local_480._M_bucket_count = 1;
  local_480._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_480._M_element_count = 0;
  local_480._M_rehash_policy._M_max_load_factor = 1.0;
  local_480._M_rehash_policy._M_next_resize = 0;
  local_480._M_single_bucket = (__node_base_ptr)0x0;
  iVar3 = getifaddrs(&local_4b0);
  if (iVar3 == -1) {
    piVar6 = __errno_location();
    uVar13 = extraout_XMM0_Da;
    uVar14 = extraout_XMM0_Db;
    if (*piVar6 != 0) {
      strerror(*piVar6);
      uVar13 = extraout_XMM0_Da_00;
      uVar14 = extraout_XMM0_Db_00;
    }
    FVar9 = FUNC_RET_ERROR;
    _log((double)CONCAT44(uVar14,uVar13));
  }
  else {
    local_4a8 = (vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>> *)
                adapterInfos;
    if (local_4b0 != (long *)0x0) {
      plVar10 = local_4b0;
      do {
        if ((plVar10[3] != 0) && ((*(byte *)(plVar10 + 2) & 8) == 0)) {
          pcVar7 = (char *)plVar10[1];
          sVar4 = mstrnlen_s(pcVar7,0x401);
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4a0,pcVar7,pcVar7 + sVar4);
          iVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&local_480,&local_4a0);
          if (iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
              ._M_cur == (__node_type *)0x0) {
            memset(local_444,0,0x414);
            mstrlcpy(local_440,(char *)plVar10[1],0x401);
            __dest = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&local_480,&local_4a0);
            memcpy(__dest,local_444,0x414);
          }
          iVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&local_480,&local_4a0);
          uVar1 = *(ushort *)plVar10[3];
          pcVar7 = "AF_PACKET";
          uVar8 = (uint)uVar1;
          if (((uVar1 != 0x11) && (pcVar7 = "AF_INET", uVar1 != 2)) && (pcVar7 = "???", uVar8 == 10)
             ) {
            pcVar7 = "AF_INET6";
          }
          printf("%-8s %s (%d)\n",plVar10[1],pcVar7,(ulong)uVar8);
          if (uVar8 == 2) {
            *(undefined4 *)
             ((long)iVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                    ._M_cur + 0x434) = *(undefined4 *)(plVar10[3] + 4);
          }
          else if ((uVar8 == 0x11) && (plVar10[6] != 0)) {
            lVar2 = plVar10[3];
            lVar12 = 0;
            do {
              *(undefined1 *)
               ((long)iVar5.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                      ._M_cur + 0x42e + lVar12) = *(undefined1 *)(lVar2 + 0xc + lVar12);
              printf("%02x:",(ulong)*(byte *)(lVar2 + 0xc + lVar12));
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            printf("\t %s\n",plVar10[1]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p);
          }
        }
        plVar10 = (long *)*plVar10;
      } while (plVar10 != (long *)0x0);
    }
    freeifaddrs(local_4b0);
    this = local_4a8;
    if (local_480._M_element_count == 0) {
      FVar9 = FUNC_RET_NOT_AVAIL;
    }
    else {
      std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::reserve
                ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
                 local_4a8,local_480._M_element_count);
      FVar9 = FUNC_RET_OK;
      for (_Var11._M_nxt = local_480._M_before_begin._M_nxt; _Var11._M_nxt != (_Hash_node_base *)0x0
          ; _Var11._M_nxt = (_Var11._M_nxt)->_M_nxt) {
        __position._M_current = *(anon_struct_1044_5_0902c47b_for_second **)(this + 8);
        if (__position._M_current == *(anon_struct_1044_5_0902c47b_for_second **)(this + 0x10)) {
          std::vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>>::
          _M_realloc_insert<license::os::OsAdapterInfo_const&>
                    (this,__position,(anon_struct_1044_5_0902c47b_for_second *)(_Var11._M_nxt + 5));
        }
        else {
          memcpy(__position._M_current,(anon_struct_1044_5_0902c47b_for_second *)(_Var11._M_nxt + 5)
                 ,0x414);
          *(long *)(this + 8) = *(long *)(this + 8) + 0x414;
        }
      }
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_480);
  return FVar9;
}

Assistant:

FUNCTION_RETURN getAdapterInfos(vector<OsAdapterInfo> &adapterInfos) {
	unordered_map<string, OsAdapterInfo> adapterByName;

	FUNCTION_RETURN f_return = FUNC_RET_OK;
	struct ifaddrs *ifaddr, *ifa;
	int family, n = 0;
	unsigned int if_num, if_max;

	if (getifaddrs(&ifaddr) == -1) {
		LOG_WARN("getifaddrs failed == -1");
		return FUNC_RET_ERROR;
	}

	for (ifa = ifaddr, n = 0, if_num = 0; ifa != NULL; ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL || (ifa->ifa_flags & IFF_LOOPBACK) != 0) {
			continue;
		}
		string if_name(ifa->ifa_name, mstrnlen_s(ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN));
		// if_name_position = ifname_position(ifnames, ifa->ifa_name, if_num);
		// interface name not seen en advance
		OsAdapterInfo *currentAdapter;
		if (adapterByName.find(if_name) == adapterByName.end()) {
			OsAdapterInfo newAdapter;
			memset(&newAdapter, 0, sizeof(OsAdapterInfo));
			mstrlcpy(&newAdapter.description[0], ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN);
			adapterByName[if_name] = newAdapter;
		}
		auto it = adapterByName.find(if_name);
		currentAdapter = &it->second;
		family = ifa->ifa_addr->sa_family;
		/* Display interface name and family (including symbolic
		 form of the latter for the common families) */
#ifndef NDEBUG
		printf("%-8s %s (%d)\n", ifa->ifa_name,
			   (family == AF_PACKET) ? "AF_PACKET"
									 : (family == AF_INET) ? "AF_INET" : (family == AF_INET6) ? "AF_INET6" : "???",
			   family);
#endif
		/* For an AF_INET* interface address, display the address
		 * || family == AF_INET6*/
		if (family == AF_INET) {
			struct sockaddr_in *s1 = (struct sockaddr_in *)ifa->ifa_addr;
			in_addr_t iaddr = s1->sin_addr.s_addr;
			currentAdapter->ipv4_address[0] = (iaddr & 0x000000ff);
			currentAdapter->ipv4_address[1] = (iaddr & 0x0000ff00) >> 8;
			currentAdapter->ipv4_address[2] = (iaddr & 0x00ff0000) >> 16;
			currentAdapter->ipv4_address[3] = (iaddr & 0xff000000) >> 24;

		} else if (family == AF_PACKET && ifa->ifa_data != NULL) {
			struct sockaddr_ll *s1 = (struct sockaddr_ll *)ifa->ifa_addr;
			int i;
			for (i = 0; i < 6; i++) {
				currentAdapter->mac_address[i] = s1->sll_addr[i];
#ifndef NDEBUG
				printf("%02x:", s1->sll_addr[i]);
#endif
			}
#ifndef NDEBUG
			printf("\t %s\n", ifa->ifa_name);
#endif
		}
	}
	freeifaddrs(ifaddr);

	// FIXME sort by eth , enps, wlan
	if (adapterByName.size() == 0) {
		f_return = FUNC_RET_NOT_AVAIL;
	} else {
		f_return = FUNC_RET_OK;
		adapterInfos.reserve(adapterByName.size());
		for (auto &it : adapterByName) {
			adapterInfos.push_back(it.second);
		}
	}
	return f_return;
}